

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.hh
# Opt level: O0

void __thiscall avro::StreamReader::readBytes(StreamReader *this,uint8_t *b,size_t n)

{
  ulong in_RDX;
  void *in_RSI;
  long in_RDI;
  size_t q;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_10 = in_RSI;
  for (local_18 = in_RDX; local_18 != 0; local_18 = local_18 - local_20) {
    if (*(long *)(in_RDI + 8) == *(long *)(in_RDI + 0x10)) {
      more(this);
    }
    local_20 = *(long *)(in_RDI + 0x10) - *(long *)(in_RDI + 8);
    if (local_18 < local_20) {
      local_20 = local_18;
    }
    memcpy(local_10,*(void **)(in_RDI + 8),local_20);
    *(ulong *)(in_RDI + 8) = local_20 + *(long *)(in_RDI + 8);
    local_10 = (void *)(local_20 + (long)local_10);
  }
  return;
}

Assistant:

void readBytes(uint8_t* b, size_t n) {
        while (n > 0) {
            if (next_ == end_) {
                more();
            }
            size_t q = end_ - next_;
            if (q > n) {
                q = n;
            }
            ::memcpy(b, next_, q);
            next_ += q;
            b += q;
            n -= q;
        }
    }